

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O0

RealType __thiscall
OpenMD::Mie::getSuggestedCutoffRadius(Mie *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  reference pvVar1;
  reference this_00;
  reference __src;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  MieInteractionData mixer;
  int mietid2;
  int mietid1;
  int atid2;
  int atid1;
  Mie *in_stack_000001e0;
  double local_58 [5];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  AtomType *local_18;
  AtomType *local_10;
  double local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDX;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_000001e0);
  }
  local_24 = AtomType::getIdent(local_18);
  local_28 = AtomType::getIdent(local_10);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_24);
  local_2c = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_28);
  local_30 = *pvVar1;
  if ((local_2c == -1) || (local_30 == -1)) {
    local_8 = 0.0;
  }
  else {
    this_00 = std::
              vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
              ::operator[]((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                            *)(in_RDI + 0x58),(long)local_2c);
    __src = std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::
            operator[](this_00,(long)local_30);
    memcpy(local_58,__src,0x28);
    local_8 = local_58[0] * 2.5;
  }
  return local_8;
}

Assistant:

RealType Mie::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int mietid1 = MieTids[atid1];
    int mietid2 = MieTids[atid2];

    if (mietid1 == -1 || mietid2 == -1)
      return 0.0;
    else {
      MieInteractionData mixer = MixingMap[mietid1][mietid2];
      return 2.5 * mixer.sigma;
    }
  }